

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderingInfoWrapper.hpp
# Opt level: O0

VkRenderingAttachmentInfoKHR * __thiscall
VulkanUtilities::RenderingInfoWrapper::GetColorAttachment(RenderingInfoWrapper *this,uint32_t Index)

{
  Char *Message;
  type pVVar1;
  undefined1 local_38 [8];
  string msg;
  uint32_t Index_local;
  RenderingInfoWrapper *this_local;
  
  msg.field_2._12_4_ = Index;
  if ((this->m_RI).colorAttachmentCount <= Index) {
    Diligent::FormatString<char[26],char[34]>
              ((string *)local_38,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Index < m_RI.colorAttachmentCount",(char (*) [34])this);
    Message = (Char *)std::__cxx11::string::c_str();
    Diligent::DebugAssertionFailed
              (Message,"GetColorAttachment",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/RenderingInfoWrapper.hpp"
               ,0x54);
    std::__cxx11::string::~string((string *)local_38);
  }
  pVVar1 = std::
           unique_ptr<VkRenderingAttachmentInfo[],_std::default_delete<VkRenderingAttachmentInfo[]>_>
           ::operator[](&this->m_Attachments,(ulong)(uint)msg.field_2._12_4_);
  return pVVar1;
}

Assistant:

VkRenderingAttachmentInfoKHR& GetColorAttachment(uint32_t Index)
    {
        VERIFY_EXPR(Index < m_RI.colorAttachmentCount);
        return m_Attachments[Index];
    }